

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O3

int64_t __thiscall
wallet::CWallet::RescanFromTime
          (CWallet *this,int64_t startTime,WalletRescanReserver *reserver,bool update)

{
  int iVar1;
  long lVar2;
  Chain *pCVar3;
  char cVar4;
  long in_FS_OFFSET;
  bool local_109;
  int64_t time_max;
  int start_height;
  undefined1 local_f8 [8];
  int *piStack_f0;
  undefined8 local_e8;
  int64_t *piStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  ScanResult result;
  uint256 start_block;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  start_height = 0;
  start_block.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  start_block.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  start_block.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  start_block.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  start_block.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  start_block.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  start_block.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  start_block.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  start_block.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  start_block.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  start_block.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  start_block.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  start_block.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  start_block.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  start_block.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  start_block.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  start_block.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  start_block.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  start_block.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  start_block.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  start_block.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  start_block.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  start_block.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  start_block.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  start_block.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  start_block.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  start_block.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  start_block.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  start_block.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  start_block.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  start_block.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  start_block.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  pCVar3 = this->m_chain;
  if (pCVar3 != (Chain *)0x0) {
    local_b8 = 0;
    uStack_b0 = 0;
    local_c8 = 0;
    uStack_c0 = 0;
    local_d8 = 0;
    uStack_d0 = 0;
    local_e8 = 0;
    piStack_e0 = (int64_t *)0x0;
    local_f8 = (undefined1  [8])&start_block;
    piStack_f0 = &start_height;
    cVar4 = (**(code **)(*(long *)pCVar3 + 0x58))(pCVar3,startTime + -0x1c20,0);
    if (cVar4 == '\0') {
      result.status = SUCCESS;
      WalletLogPrintf<char[15],int>
                (this,(ConstevalFormatString<2U>)0x489316,(char (*) [15])"RescanFromTime",
                 (int *)&result);
    }
    else {
      local_f8 = (undefined1  [8])&this->cs_wallet;
      piStack_f0 = (int *)((ulong)piStack_f0 & 0xffffffffffffff00);
      std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)local_f8);
      iVar1 = this->m_last_block_processed_height;
      if (iVar1 < 0) {
        __assert_fail("m_last_block_processed_height >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.h"
                      ,0x3d1,"int wallet::CWallet::GetLastBlockHeight() const");
      }
      std::unique_lock<std::recursive_mutex>::~unique_lock
                ((unique_lock<std::recursive_mutex> *)local_f8);
      result.status = (iVar1 - start_height) + FAILURE;
      WalletLogPrintf<char[15],int>
                (this,(ConstevalFormatString<2U>)0x489316,(char (*) [15])"RescanFromTime",
                 (int *)&result);
      ScanForWalletTransactions
                (&result,this,&start_block,start_height,(optional<int>)0x0,reserver,update,false);
      if (result.status == FAILURE) {
        pCVar3 = this->m_chain;
        if (pCVar3 == (Chain *)0x0) goto LAB_001622cd;
        local_e8 = 0;
        local_b8 = 0;
        uStack_b0 = 0;
        local_c8 = 0;
        uStack_c0 = 0;
        local_d8 = 0;
        uStack_d0 = 0;
        local_f8 = (undefined1  [8])0x0;
        piStack_f0 = (int *)0x0;
        piStack_e0 = &time_max;
        local_109 = (bool)(**(code **)(*(long *)pCVar3 + 0x50))(pCVar3,&result.last_failed_block);
        inline_check_non_fatal<bool>
                  (&local_109,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp"
                   ,0x737,"RescanFromTime",
                   "chain().findBlock(result.last_failed_block, FoundBlock().maxTime(time_max))");
        startTime = time_max + 0x1c21;
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
      __stack_chk_fail();
    }
    return startTime;
  }
LAB_001622cd:
  __assert_fail("m_chain",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.h"
                ,0x1f5,"interfaces::Chain &wallet::CWallet::chain() const");
}

Assistant:

int64_t CWallet::RescanFromTime(int64_t startTime, const WalletRescanReserver& reserver, bool update)
{
    // Find starting block. May be null if nCreateTime is greater than the
    // highest blockchain timestamp, in which case there is nothing that needs
    // to be scanned.
    int start_height = 0;
    uint256 start_block;
    bool start = chain().findFirstBlockWithTimeAndHeight(startTime - TIMESTAMP_WINDOW, 0, FoundBlock().hash(start_block).height(start_height));
    WalletLogPrintf("%s: Rescanning last %i blocks\n", __func__, start ? WITH_LOCK(cs_wallet, return GetLastBlockHeight()) - start_height + 1 : 0);

    if (start) {
        // TODO: this should take into account failure by ScanResult::USER_ABORT
        ScanResult result = ScanForWalletTransactions(start_block, start_height, /*max_height=*/{}, reserver, /*fUpdate=*/update, /*save_progress=*/false);
        if (result.status == ScanResult::FAILURE) {
            int64_t time_max;
            CHECK_NONFATAL(chain().findBlock(result.last_failed_block, FoundBlock().maxTime(time_max)));
            return time_max + TIMESTAMP_WINDOW + 1;
        }
    }
    return startTime;
}